

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O3

int s2pred::TriageCompareSin2Distances<double>
              (Vector3<double> *x,Vector3<double> *a,Vector3<double> *b)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar10 = a->c_[2] - x->c_[2];
  dVar6 = x->c_[1] + a->c_[1];
  dVar8 = x->c_[2] + a->c_[2];
  dVar3 = a->c_[0] - x->c_[0];
  dVar4 = a->c_[1] - x->c_[1];
  dVar2 = a->c_[0] + x->c_[0];
  dVar5 = dVar2 * dVar10 - dVar8 * dVar3;
  dVar2 = dVar3 * dVar6 - dVar4 * dVar2;
  dVar10 = dVar4 * dVar8 - dVar10 * dVar6;
  dVar10 = (dVar10 * dVar10 + dVar5 * dVar5 + dVar2 * dVar2) * 0.25;
  if (dVar10 < 0.0) {
    dVar2 = sqrt(dVar10);
  }
  else {
    dVar2 = SQRT(dVar10);
  }
  dVar3 = b->c_[2] - x->c_[2];
  dVar7 = x->c_[1] + b->c_[1];
  dVar9 = x->c_[2] + b->c_[2];
  dVar5 = b->c_[0] - x->c_[0];
  dVar6 = b->c_[1] - x->c_[1];
  dVar4 = b->c_[0] + x->c_[0];
  dVar8 = dVar4 * dVar3 - dVar9 * dVar5;
  dVar4 = dVar5 * dVar7 - dVar6 * dVar4;
  dVar3 = dVar6 * dVar9 - dVar3 * dVar7;
  dVar3 = (dVar3 * dVar3 + dVar8 * dVar8 + dVar4 * dVar4) * 0.25;
  if (dVar3 < 0.0) {
    dVar4 = sqrt(dVar3);
  }
  else {
    dVar4 = SQRT(dVar3);
  }
  dVar2 = dVar4 * 6.831735839737845e-31 + dVar3 * 3.100653426266254e-15 + 1.166815364598964e-61 +
          dVar10 * 3.100653426266254e-15 + dVar2 * 6.831735839737845e-31 + 1.166815364598964e-61;
  iVar1 = 1;
  if (dVar10 - dVar3 <= dVar2) {
    iVar1 = -(uint)(dVar10 - dVar3 < -dVar2);
  }
  return iVar1;
}

Assistant:

int TriageCompareSin2Distances(const Vector3<T>& x,
                               const Vector3<T>& a, const Vector3<T>& b) {
  T sin2_ax_error, sin2_bx_error;
  T sin2_ax = GetSin2Distance(a, x, &sin2_ax_error);
  T sin2_bx = GetSin2Distance(b, x, &sin2_bx_error);
  T diff = sin2_ax - sin2_bx;
  T error = sin2_ax_error + sin2_bx_error;
  return (diff > error) ? 1 : (diff < -error) ? -1 : 0;
}